

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getType_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  uint uVar1;
  char *local_50;
  allocator<char> local_19;
  ModuleDeclaration *local_18;
  ModuleDeclaration *this_local;
  
  local_18 = this;
  this_local = (ModuleDeclaration *)__return_storage_ptr__;
  uVar1 = (*(this->module->super_ASTObject)._vptr_ASTObject[6])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(this->module->super_ASTObject)._vptr_ASTObject[5])();
    local_50 = "processor";
    if ((uVar1 & 1) != 0) {
      local_50 = "graph";
    }
  }
  else {
    local_50 = "namespace";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_50,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getType() const
{
    return module.isNamespace() ? "namespace"
                                : (module.isGraph() ? "graph" : "processor");
}